

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O3

void vera::shader(Shader *_program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  col_type *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  size_t sVar20;
  double dVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  int iVar23;
  int iVar24;
  undefined8 *puVar25;
  mat4 *pmVar26;
  mat3 *_value;
  float *pfVar27;
  long lVar28;
  _Rb_tree_node_base *p_Var29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  vec4 vVar46;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  mat4 local_98;
  string local_58;
  float local_34;
  
  if ((shaderPtr != fill_shader) || (shaderPtr != points_shader)) {
    shaderChange = 1;
    shaderPtr = _program;
  }
  _program->textureIndex = 0;
  Shader::use(_program);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98.value + 1);
  local_98.value[0]._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_date","");
  vVar46 = getDate();
  Shader::setUniform(_program,(string *)&local_98,vVar46.field_0.x,vVar46.field_1.y,vVar46.field_2.z
                     ,vVar46.field_3.w);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value[0]._0_8_ != paVar1) {
    operator_delete((void *)local_98.value[0]._0_8_);
  }
  local_98.value[0]._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_resolution","");
  iVar23 = getWindowWidth();
  iVar24 = getWindowHeight();
  Shader::setUniform(_program,(string *)&local_98,(float)iVar23,(float)iVar24);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value[0]._0_8_ != paVar1) {
    operator_delete((void *)local_98.value[0]._0_8_);
  }
  local_98.value[0]._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_mouse","");
  local_34 = getMouseX();
  fVar30 = getMouseY();
  Shader::setUniform(_program,(string *)&local_98,local_34,fVar30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value[0]._0_8_ != paVar1) {
    operator_delete((void *)local_98.value[0]._0_8_);
  }
  local_98.value[0]._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_time","");
  dVar21 = getTimeSec();
  Shader::setUniform(_program,(string *)&local_98,(float)dVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value[0]._0_8_ != paVar1) {
    operator_delete((void *)local_98.value[0]._0_8_);
  }
  local_98.value[0]._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_delta","");
  dVar21 = getDelta();
  Shader::setUniform(_program,(string *)&local_98,(float)dVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value[0]._0_8_ != paVar1) {
    operator_delete((void *)local_98.value[0]._0_8_);
  }
  if (fill_shader == _program) {
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_color","");
    Shader::setUniform(_program,(string *)&local_98,fill_color,DAT_0043115c,DAT_00431160,
                       DAT_00431164);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
  }
  else if (points_shader == _program) {
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_size","");
    Shader::setUniform(_program,(string *)&local_98,points_size);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_shape","");
    Shader::setUniform(_program,(string *)&local_98,points_shape);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_color","");
    Shader::setUniform(_program,(string *)&local_98,fill_color,DAT_0043115c,DAT_00431160,
                       DAT_00431164);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    glEnable(0x8861);
    glEnable(0x8642);
  }
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  if (*(long *)(scene + 0x1f0) == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"u_modelViewProjectionMatrix","");
    pmVar26 = getFlippedOrthoMatrix();
    uVar4 = pmVar26->value[0].field_0;
    uVar12 = pmVar26->value[0].field_1;
    uVar5 = pmVar26->value[0].field_2;
    uVar13 = pmVar26->value[0].field_3;
    uVar6 = pmVar26->value[1].field_0;
    uVar14 = pmVar26->value[1].field_1;
    uVar7 = pmVar26->value[1].field_2;
    uVar15 = pmVar26->value[1].field_3;
    uVar8 = pmVar26->value[2].field_0;
    uVar16 = pmVar26->value[2].field_1;
    uVar9 = pmVar26->value[2].field_2;
    uVar17 = pmVar26->value[2].field_3;
    uVar10 = pmVar26->value[3].field_0;
    uVar18 = pmVar26->value[3].field_1;
    uVar11 = pmVar26->value[3].field_2;
    uVar19 = pmVar26->value[3].field_3;
    local_98.value[0].field_0.x =
         (float)uVar10 * DAT_004311b4._4_4_ +
         (float)uVar8 * (float)DAT_004311b4 +
         (float)uVar6 * matrix_world._4_4_ + (float)uVar4 * (float)matrix_world;
    local_98.value[0].field_1.y =
         (float)uVar18 * DAT_004311b4._4_4_ +
         (float)uVar16 * (float)DAT_004311b4 +
         (float)uVar14 * matrix_world._4_4_ + (float)uVar12 * (float)matrix_world;
    local_98.value[0].field_2.z =
         DAT_004311b4._4_4_ * (float)uVar11 +
         (float)DAT_004311b4 * (float)uVar9 +
         matrix_world._4_4_ * (float)uVar7 + (float)matrix_world * (float)uVar5;
    local_98.value[0].field_3.w =
         DAT_004311b4._4_4_ * (float)uVar19 +
         (float)DAT_004311b4 * (float)uVar17 +
         matrix_world._4_4_ * (float)uVar15 + (float)matrix_world * (float)uVar13;
    local_98.value[1].field_0.x =
         (float)uVar10 * DAT_004311c4._4_4_ +
         (float)uVar8 * (float)DAT_004311c4 +
         (float)uVar6 * DAT_004311bc._4_4_ + (float)uVar4 * (float)DAT_004311bc;
    local_98.value[1].field_1.y =
         (float)uVar18 * DAT_004311c4._4_4_ +
         (float)uVar16 * (float)DAT_004311c4 +
         (float)uVar14 * DAT_004311bc._4_4_ + (float)uVar12 * (float)DAT_004311bc;
    local_98.value[1].field_3.w =
         DAT_004311c4._4_4_ * (float)uVar19 +
         (float)DAT_004311c4 * (float)uVar17 +
         DAT_004311bc._4_4_ * (float)uVar15 + (float)DAT_004311bc * (float)uVar13;
    local_98.value[1].field_2.z =
         DAT_004311c4._4_4_ * (float)uVar11 +
         (float)DAT_004311c4 * (float)uVar9 +
         DAT_004311bc._4_4_ * (float)uVar7 + (float)DAT_004311bc * (float)uVar5;
    local_98.value[2].field_2.z =
         DAT_004311d4._4_4_ * (float)uVar11 +
         (float)DAT_004311d4 * (float)uVar9 +
         DAT_004311cc._4_4_ * (float)uVar7 + (float)DAT_004311cc * (float)uVar5;
    local_98.value[2].field_1.y =
         (float)uVar18 * DAT_004311d4._4_4_ +
         (float)uVar16 * (float)DAT_004311d4 +
         (float)uVar14 * DAT_004311cc._4_4_ + (float)uVar12 * (float)DAT_004311cc;
    local_98.value[2].field_0.x =
         (float)uVar10 * DAT_004311d4._4_4_ +
         (float)uVar8 * (float)DAT_004311d4 +
         (float)uVar6 * DAT_004311cc._4_4_ + (float)uVar4 * (float)DAT_004311cc;
    local_98.value[3].field_3.w =
         DAT_004311e4._4_4_ * (float)uVar19 +
         (float)DAT_004311e4 * (float)uVar17 +
         DAT_004311dc._4_4_ * (float)uVar15 + (float)DAT_004311dc * (float)uVar13;
    local_98.value[3].field_0.x =
         (float)uVar10 * DAT_004311e4._4_4_ +
         (float)uVar8 * (float)DAT_004311e4 +
         (float)uVar6 * DAT_004311dc._4_4_ + (float)uVar4 * (float)DAT_004311dc;
    local_98.value[2].field_3.w =
         DAT_004311d4._4_4_ * (float)uVar19 +
         (float)DAT_004311d4 * (float)uVar17 +
         DAT_004311cc._4_4_ * (float)uVar15 + (float)DAT_004311cc * (float)uVar13;
    local_98.value[3].field_2.z =
         DAT_004311e4._4_4_ * (float)uVar11 +
         (float)DAT_004311e4 * (float)uVar9 +
         DAT_004311dc._4_4_ * (float)uVar7 + (float)DAT_004311dc * (float)uVar5;
    local_98.value[3].field_1.y =
         (float)uVar18 * DAT_004311e4._4_4_ +
         (float)uVar16 * (float)DAT_004311e4 +
         (float)uVar14 * DAT_004311dc._4_4_ + (float)uVar12 * (float)DAT_004311dc;
    Shader::setUniform(_program,&local_58,&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_projectionMatrix","");
    pmVar26 = getFlippedOrthoMatrix();
    Shader::setUniform(_program,(string *)&local_98,pmVar26,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u_viewMatrix","");
    local_98.value[0].field_0.x = 1.0;
    local_98.value[0].field_1.y = 0.0;
    local_98.value[0].field_2.z = 0.0;
    local_98.value[0].field_3.w = 0.0;
    local_98.value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    local_98.value[1].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
    local_98.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_98.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    local_98.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    local_98.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    local_98.value[2].field_2.z = 1.0;
    local_98.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    local_98.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    local_98.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    local_98.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_98.value[3].field_3.w = 1.0;
    Shader::setUniform(_program,&local_58,&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u_normalMatrix","");
    local_98.value[0].field_0.x = 1.0;
    local_98.value[0].field_1.y = 0.0;
    local_98.value[0].field_2.z = 0.0;
    local_98.value[0].field_3.w = 0.0;
    local_98.value[1].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_98.value[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    local_98.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_98.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    local_98.value[2].field_0.x = 1.0;
    Shader::setUniform(_program,&local_58,(mat3 *)&local_98,false);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_98.value[0].field_1,local_98.value[0].field_0);
    local_98.value[0]._0_8_ = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar2) goto LAB_001fde86;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"u_modelViewProjectionMatrix","");
    puVar25 = (undefined8 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2d0))();
    fVar30 = (float)puVar25[6];
    fVar31 = (float)((ulong)puVar25[6] >> 0x20);
    fVar44 = (float)*puVar25;
    fVar45 = (float)((ulong)*puVar25 >> 0x20);
    fVar42 = (float)puVar25[2];
    fVar43 = (float)((ulong)puVar25[2] >> 0x20);
    fVar40 = (float)puVar25[4];
    fVar41 = (float)((ulong)puVar25[4] >> 0x20);
    local_98.value[0].field_0.x =
         fVar30 * DAT_004311b4._4_4_ +
         fVar40 * (float)DAT_004311b4 + fVar42 * matrix_world._4_4_ + fVar44 * (float)matrix_world;
    local_98.value[0].field_1.y =
         fVar31 * DAT_004311b4._4_4_ +
         fVar41 * (float)DAT_004311b4 + fVar43 * matrix_world._4_4_ + fVar45 * (float)matrix_world;
    fVar36 = (float)puVar25[1];
    fVar37 = (float)((ulong)puVar25[1] >> 0x20);
    fVar38 = (float)puVar25[3];
    fVar39 = (float)((ulong)puVar25[3] >> 0x20);
    fVar34 = (float)puVar25[5];
    fVar35 = (float)((ulong)puVar25[5] >> 0x20);
    fVar32 = (float)puVar25[7];
    fVar33 = (float)((ulong)puVar25[7] >> 0x20);
    local_98.value[0].field_2.z =
         DAT_004311b4._4_4_ * fVar32 +
         (float)DAT_004311b4 * fVar34 + matrix_world._4_4_ * fVar38 + (float)matrix_world * fVar36;
    local_98.value[0].field_3.w =
         DAT_004311b4._4_4_ * fVar33 +
         (float)DAT_004311b4 * fVar35 + matrix_world._4_4_ * fVar39 + (float)matrix_world * fVar37;
    local_98.value[1].field_0.x =
         fVar30 * DAT_004311c4._4_4_ +
         fVar40 * (float)DAT_004311c4 + fVar42 * DAT_004311bc._4_4_ + fVar44 * (float)DAT_004311bc;
    local_98.value[1].field_1.y =
         fVar31 * DAT_004311c4._4_4_ +
         fVar41 * (float)DAT_004311c4 + fVar43 * DAT_004311bc._4_4_ + fVar45 * (float)DAT_004311bc;
    local_98.value[1].field_3.w =
         DAT_004311c4._4_4_ * fVar33 +
         (float)DAT_004311c4 * fVar35 + DAT_004311bc._4_4_ * fVar39 + (float)DAT_004311bc * fVar37;
    local_98.value[1].field_2.z =
         DAT_004311c4._4_4_ * fVar32 +
         (float)DAT_004311c4 * fVar34 + DAT_004311bc._4_4_ * fVar38 + (float)DAT_004311bc * fVar36;
    local_98.value[2].field_2.z =
         DAT_004311d4._4_4_ * fVar32 +
         (float)DAT_004311d4 * fVar34 + DAT_004311cc._4_4_ * fVar38 + (float)DAT_004311cc * fVar36;
    local_98.value[2].field_1.y =
         fVar31 * DAT_004311d4._4_4_ +
         fVar41 * (float)DAT_004311d4 + fVar43 * DAT_004311cc._4_4_ + fVar45 * (float)DAT_004311cc;
    local_98.value[2].field_0.x =
         fVar30 * DAT_004311d4._4_4_ +
         fVar40 * (float)DAT_004311d4 + fVar42 * DAT_004311cc._4_4_ + fVar44 * (float)DAT_004311cc;
    local_98.value[3].field_3.w =
         DAT_004311e4._4_4_ * fVar33 +
         (float)DAT_004311e4 * fVar35 + DAT_004311dc._4_4_ * fVar39 + (float)DAT_004311dc * fVar37;
    local_98.value[3].field_0.x =
         fVar30 * DAT_004311e4._4_4_ +
         fVar40 * (float)DAT_004311e4 + fVar42 * DAT_004311dc._4_4_ + fVar44 * (float)DAT_004311dc;
    local_98.value[2].field_3.w =
         DAT_004311d4._4_4_ * fVar33 +
         (float)DAT_004311d4 * fVar35 + DAT_004311cc._4_4_ * fVar39 + (float)DAT_004311cc * fVar37;
    local_98.value[3].field_2.z =
         DAT_004311e4._4_4_ * fVar32 +
         (float)DAT_004311e4 * fVar34 + DAT_004311dc._4_4_ * fVar38 + (float)DAT_004311dc * fVar36;
    local_98.value[3].field_1.y =
         fVar31 * DAT_004311e4._4_4_ +
         fVar41 * (float)DAT_004311e4 + fVar43 * DAT_004311dc._4_4_ + fVar45 * (float)DAT_004311dc;
    Shader::setUniform(_program,&local_58,&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_projectionMatrix","");
    pmVar26 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2c8))();
    Shader::setUniform(_program,(string *)&local_98,pmVar26,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_normalMatrix","");
    _value = (mat3 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b8))();
    Shader::setUniform(_program,(string *)&local_98,_value,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_viewMatrix","");
    pmVar26 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b0))();
    Shader::setUniform(_program,(string *)&local_98,pmVar26,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_camera","");
    pfVar27 = (float *)(**(code **)(**(long **)(scene + 0x1f0) + 0x98))();
    Shader::setUniform(_program,(string *)&local_98,-*pfVar27,-pfVar27[1],-pfVar27[2]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraDistance","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x278))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraNearClip","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x270))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraFarClip","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x268))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraEv100","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x280))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraExposure","");
    dVar21 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(_program,(string *)&local_98,(float)dVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraAperture","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x290))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraShutterSpeed","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x298))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraSensitivity","");
    fVar30 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x2a0))();
    Shader::setUniform(_program,(string *)&local_98,fVar30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_cameraChange","");
    Shader::setUniform(_program,(string *)&local_98,(uint)*(byte *)(*(long *)(scene + 0x1f0) + 0x20)
                      );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_98.value[0]._0_8_);
    }
    local_98.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_iblLuminance","");
    dVar21 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(_program,(string *)&local_98,(float)(dVar21 * 30000.0));
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98.value[0]._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value[0]._0_8_ == paVar1) goto LAB_001fde86;
  }
  operator_delete((void *)local_98.value[0]._0_8_);
  local_98.value[0]._0_8_ = paVar22;
LAB_001fde86:
  local_98.value[0]._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_modelMatrix","");
  Shader::setUniform(_program,(string *)&local_98,(mat4 *)&matrix_world,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value[0]._0_8_ != paVar1) {
    operator_delete((void *)local_98.value[0]._0_8_);
  }
  if (lights_enabled == '\x01') {
    p_Var29 = *(_Rb_tree_node_base **)(scene + 0xe0);
    if (*(long *)(scene + 0xf0) == 1) {
      pcVar3 = local_98.value + 1;
      local_98.value[0]._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_lightColor","");
      lVar28 = *(long *)(p_Var29 + 2);
      Shader::setUniform(_program,(string *)&local_98,*(float *)(lVar28 + 0xb0),
                         *(float *)(lVar28 + 0xb4),*(float *)(lVar28 + 0xb8));
      if ((col_type *)local_98.value[0]._0_8_ != pcVar3) {
        operator_delete((void *)local_98.value[0]._0_8_);
      }
      local_98.value[0]._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_lightIntensity","");
      Shader::setUniform(_program,(string *)&local_98,*(float *)(*(long *)(p_Var29 + 2) + 200));
      if ((col_type *)local_98.value[0]._0_8_ != pcVar3) {
        operator_delete((void *)local_98.value[0]._0_8_);
      }
      local_98.value[0]._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_light","");
      pfVar27 = (float *)(**(code **)(**(long **)(p_Var29 + 2) + 0x98))();
      Shader::setUniform(_program,(string *)&local_98,*pfVar27,pfVar27[1],pfVar27[2]);
      if ((col_type *)local_98.value[0]._0_8_ != pcVar3) {
        operator_delete((void *)local_98.value[0]._0_8_);
      }
      lVar28 = *(long *)(p_Var29 + 2);
      if ((*(uint *)(lVar28 + 0x210) & 0xfffffffd) == 0) {
        local_98.value[0]._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_lightDirection","");
        lVar28 = *(long *)(p_Var29 + 2);
        Shader::setUniform(_program,(string *)&local_98,*(float *)(lVar28 + 0xbc),
                           *(float *)(lVar28 + 0xc0),*(float *)(lVar28 + 0xc4));
        if ((col_type *)local_98.value[0]._0_8_ != pcVar3) {
          operator_delete((void *)local_98.value[0]._0_8_);
        }
        lVar28 = *(long *)(p_Var29 + 2);
      }
      if (0.0 < *(float *)(lVar28 + 0xcc)) {
        local_98.value[0]._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_lightFalloff","");
        Shader::setUniform(_program,(string *)&local_98,*(float *)(*(long *)(p_Var29 + 2) + 0xcc));
        if ((col_type *)local_98.value[0]._0_8_ != pcVar3) {
          operator_delete((void *)local_98.value[0]._0_8_);
        }
      }
      local_98.value[0]._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_lightMatrix","");
      Shader::setUniform(_program,(string *)&local_98,(mat4 *)(*(long *)(p_Var29 + 2) + 0x1c8),false
                        );
      if ((col_type *)local_98.value[0]._0_8_ != pcVar3) {
        operator_delete((void *)local_98.value[0]._0_8_);
      }
      if (*(char *)(*(long *)(p_Var29 + 2) + 0x100) == '\x01') {
        local_98.value[0]._0_8_ = local_98.value + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_lightShadowMap","");
        lVar28 = *(long *)(p_Var29 + 2);
        sVar20 = _program->textureIndex;
        _program->textureIndex = sVar20 + 1;
        Shader::setUniformDepthTexture(_program,(string *)&local_98,(Fbo *)(lVar28 + 0xd0),sVar20);
        if ((col_type *)local_98.value[0]._0_8_ != local_98.value + 1) {
          operator_delete((void *)local_98.value[0]._0_8_);
        }
      }
    }
    else if (p_Var29 != (_Rb_tree_node_base *)(scene + 0xd0)) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_98,"u_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var29 + 1));
        local_58._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_98.value[0]._0_8_,
                   (char *)(local_98.value[0]._0_8_ +
                           CONCAT44(local_98.value[0].field_3,local_98.value[0].field_2)));
        std::__cxx11::string::append((char *)&local_58);
        lVar28 = *(long *)(p_Var29 + 2);
        Shader::setUniform(_program,&local_58,*(float *)(lVar28 + 0xb0),*(float *)(lVar28 + 0xb4),
                           *(float *)(lVar28 + 0xb8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        local_58._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_98.value[0]._0_8_,
                   (char *)(local_98.value[0]._0_8_ +
                           CONCAT44(local_98.value[0].field_3,local_98.value[0].field_2)));
        std::__cxx11::string::append((char *)&local_58);
        Shader::setUniform(_program,&local_58,*(float *)(*(long *)(p_Var29 + 2) + 200));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((int)(*(long **)(p_Var29 + 2))[0x42] == 0) {
LAB_001fe55a:
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_98.value[0]._0_8_,
                     (char *)(local_98.value[0]._0_8_ +
                             CONCAT44(local_98.value[0].field_3,local_98.value[0].field_2)));
          std::__cxx11::string::append((char *)&local_58);
          lVar28 = *(long *)(p_Var29 + 2);
          Shader::setUniform(_program,&local_58,*(float *)(lVar28 + 0xbc),*(float *)(lVar28 + 0xc0),
                             *(float *)(lVar28 + 0xc4));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          lVar28 = *(long *)(p_Var29 + 2);
        }
        else {
          pfVar27 = (float *)(**(code **)(**(long **)(p_Var29 + 2) + 0x98))();
          Shader::setUniform(_program,(string *)&local_98,*pfVar27,pfVar27[1],pfVar27[2]);
          lVar28 = *(long *)(p_Var29 + 2);
          if ((*(uint *)(lVar28 + 0x210) & 0xfffffffd) == 0) goto LAB_001fe55a;
        }
        if (0.0 < *(float *)(lVar28 + 0xcc)) {
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_98.value[0]._0_8_,
                     (char *)(local_98.value[0]._0_8_ +
                             CONCAT44(local_98.value[0].field_3,local_98.value[0].field_2)));
          std::__cxx11::string::append((char *)&local_58);
          Shader::setUniform(_program,&local_58,*(float *)(*(long *)(p_Var29 + 2) + 0xcc));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
        local_58._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_98.value[0]._0_8_,
                   (char *)(local_98.value[0]._0_8_ +
                           CONCAT44(local_98.value[0].field_3,local_98.value[0].field_2)));
        std::__cxx11::string::append((char *)&local_58);
        Shader::setUniform(_program,&local_58,(mat4 *)(*(long *)(p_Var29 + 2) + 0x1c8),false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if (*(char *)(*(long *)(p_Var29 + 2) + 0x100) == '\x01') {
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_98.value[0]._0_8_,
                     (char *)(local_98.value[0]._0_8_ +
                             CONCAT44(local_98.value[0].field_3,local_98.value[0].field_2)));
          std::__cxx11::string::append((char *)&local_58);
          lVar28 = *(long *)(p_Var29 + 2);
          sVar20 = _program->textureIndex;
          _program->textureIndex = sVar20 + 1;
          Shader::setUniformDepthTexture(_program,&local_58,(Fbo *)(lVar28 + 0xd0),sVar20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
        if ((col_type *)local_98.value[0]._0_8_ != local_98.value + 1) {
          operator_delete((void *)local_98.value[0]._0_8_);
        }
        p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
      } while (p_Var29 != (_Rb_tree_node_base *)(scene + 0xd0));
    }
  }
  return;
}

Assistant:

void shader(Shader* _program) {
    if (shaderPtr != fill_shader || shaderPtr != points_shader) {
        shaderPtr = _program; 
        shaderChange = true;
    }

    _program->textureIndex = 0;
    _program->use();

    _program->setUniform("u_date", getDate() );
    _program->setUniform("u_resolution", (float)getWindowWidth(), (float)getWindowHeight() );
    _program->setUniform("u_mouse", (float)getMouseX(), (float)getMouseY() );
    _program->setUniform("u_time", (float)getTimeSec() );
    _program->setUniform("u_delta", (float)getDelta() );

    if (_program == fill_shader)
        _program->setUniform("u_color", fill_color);
    else if (_program == points_shader) {
        _program->setUniform("u_size", points_size);
        _program->setUniform("u_shape", points_shape);
        _program->setUniform("u_color", fill_color);
        #if !defined(PLATFORM_RPI) && !defined(DRIVER_GBM) && !defined(_WIN32) && !defined(__EMSCRIPTEN__)
        glEnable(GL_POINT_SPRITE);
        glEnable(GL_VERTEX_PROGRAM_POINT_SIZE);
        #endif
    }

    if (scene->activeCamera) {
        _program->setUniform("u_modelViewProjectionMatrix", scene->activeCamera->getProjectionViewMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", scene->activeCamera->getProjectionMatrix());
        _program->setUniform("u_normalMatrix", scene->activeCamera->getNormalMatrix());
        _program->setUniform("u_viewMatrix", scene->activeCamera->getViewMatrix() );

        _program->setUniform("u_camera", -scene->activeCamera->getPosition() );
        _program->setUniform("u_cameraDistance", scene->activeCamera->getDistance());
        _program->setUniform("u_cameraNearClip", scene->activeCamera->getNearClip());
        _program->setUniform("u_cameraFarClip", scene->activeCamera->getFarClip());
        _program->setUniform("u_cameraEv100", scene->activeCamera->getEv100());
        _program->setUniform("u_cameraExposure", float(scene->activeCamera->getExposure()));
        _program->setUniform("u_cameraAperture", scene->activeCamera->getAperture());
        _program->setUniform("u_cameraShutterSpeed", scene->activeCamera->getShutterSpeed());
        _program->setUniform("u_cameraSensitivity", scene->activeCamera->getSensitivity());
        _program->setUniform("u_cameraChange", scene->activeCamera->bChange);
        _program->setUniform("u_iblLuminance", float(30000.0f * scene->activeCamera->getExposure()));
    }
    else {
        _program->setUniform("u_modelViewProjectionMatrix", getFlippedOrthoMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", getFlippedOrthoMatrix() );
        _program->setUniform("u_viewMatrix", glm::mat4(1.0f) );
        _program->setUniform("u_normalMatrix", glm::mat3(1.0f) );
    }

    _program->setUniform("u_modelMatrix", matrix_world );

    if (lights_enabled) {
        // Pass Light Uniforms
        if (scene->lights.size() == 1) {
            LightsMap::iterator it = scene->lights.begin();

            _program->setUniform("u_lightColor", it->second->color);
            _program->setUniform("u_lightIntensity", it->second->intensity);

            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _program->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _program->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _program->setUniform("u_lightFalloff", it->second->falloff);

            _program->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );

            if (it->second->getShadowMap()->isAllocated())
                _program->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
        }
        else {
            for (LightsMap::iterator it = scene->lights.begin(); it != scene->lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _program->setUniform(name + "Color", it->second->color);
                _program->setUniform(name + "Intensity", it->second->intensity);
                if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                    _program->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _program->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _program->setUniform(name +"Falloff", it->second->falloff);

                _program->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );

                if (it->second->getShadowMap()->isAllocated())
                    _program->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
            }
        } 
    }
}